

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O3

void __thiscall
sznet::detail::FixedBuffer<4000>::append(FixedBuffer<4000> *this,char *buf,size_t len)

{
  char **ppcVar1;
  
  ppcVar1 = &this->m_cur;
  if (len < (ulong)(long)((int)ppcVar1 - (int)this->m_cur)) {
    memcpy(this->m_cur,buf,len);
    *ppcVar1 = *ppcVar1 + len;
  }
  return;
}

Assistant:

void append(const char* buf, size_t len)
	{
		if ((implicit_cast<size_t>(avail()) > len))
		{
			memcpy(m_cur, buf, len);
			m_cur += len;
		}
	}